

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long mkvparser::UnserializeInt(IMkvReader *pReader,longlong pos,longlong size,longlong *result_ref)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  uchar b;
  char first_byte;
  ulong *local_38;
  
  if (size - 9U < 0xfffffffffffffff8 || (pos < 0 || pReader == (IMkvReader *)0x0)) {
    lVar3 = -2;
  }
  else {
    first_byte = '\0';
    iVar1 = (**pReader->_vptr_IMkvReader)(pReader,pos,1);
    if (iVar1 < 0) {
LAB_0014f624:
      lVar3 = (long)iVar1;
    }
    else {
      uVar2 = (ulong)first_byte;
      lVar4 = pos + 1;
      lVar3 = size + -1;
      local_38 = (ulong *)result_ref;
      while (bVar5 = lVar3 != 0, lVar3 = lVar3 + -1, bVar5) {
        iVar1 = (**pReader->_vptr_IMkvReader)(pReader,lVar4,1,&b);
        if (iVar1 < 0) goto LAB_0014f624;
        uVar2 = uVar2 << 8 | (ulong)b;
        lVar4 = lVar4 + 1;
      }
      *local_38 = uVar2;
      lVar3 = 0;
    }
  }
  return lVar3;
}

Assistant:

long UnserializeInt(IMkvReader* pReader, long long pos, long long size,
                    long long& result_ref) {
  if (!pReader || pos < 0 || size < 1 || size > 8)
    return E_FILE_FORMAT_INVALID;

  signed char first_byte = 0;
  const long status = pReader->Read(pos, 1, (unsigned char*)&first_byte);

  if (status < 0)
    return status;

  unsigned long long result = static_cast<unsigned long long>(first_byte);
  ++pos;

  for (long i = 1; i < size; ++i) {
    unsigned char b;

    const long status = pReader->Read(pos, 1, &b);

    if (status < 0)
      return status;

    result <<= 8;
    result |= b;

    ++pos;
  }

  result_ref = static_cast<long long>(result);
  return 0;
}